

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O3

Result<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::fieldidx<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
          (size_t *__return_storage_ptr__,ParseInput *ctx)

{
  Result<wasm::WATParser::Ok> *pRVar1;
  _Optional_payload_base<unsigned_int> _Var2;
  Result<wasm::WATParser::Ok> *extraout_RAX;
  string local_68;
  undefined1 local_48 [8];
  optional<wasm::Name> id;
  
  _Var2 = (_Optional_payload_base<unsigned_int>)ParseInput::takeU32(ctx);
  if ((((ulong)_Var2 >> 0x20 & 1) != 0) ||
     (_Var2 = (_Optional_payload_base<unsigned_int>)
              ParseInput::takeID((optional<wasm::Name> *)local_48,ctx),
     id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
     super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\x01')) {
    *(undefined1 *)(__return_storage_ptr__ + 4) = 0;
    return (Result<wasm::WATParser::Ok> *)_Var2;
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"expected field index or identifier","");
  ParseInput::err((Err *)local_48,ctx,&local_68);
  *__return_storage_ptr__ = (size_t)(__return_storage_ptr__ + 2);
  pRVar1 = (Result<wasm::WATParser::Ok> *)
           ((long)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._M_payload + 8);
  if (local_48 == (undefined1  [8])pRVar1) {
    __return_storage_ptr__[2] =
         CONCAT71(id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>._M_payload._9_7_,
                  id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>._M_payload._8_1_);
    __return_storage_ptr__[3] =
         id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Name>._16_8_;
  }
  else {
    *__return_storage_ptr__ = (size_t)local_48;
    __return_storage_ptr__[2] =
         CONCAT71(id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>._M_payload._9_7_,
                  id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>._M_payload._8_1_);
  }
  __return_storage_ptr__[1] =
       id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len;
  id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len = 0;
  id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._M_payload._8_1_ = 0;
  *(undefined1 *)(__return_storage_ptr__ + 4) = 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == &local_68.field_2) {
    return pRVar1;
  }
  local_48 = (undefined1  [8])pRVar1;
  operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  return extraout_RAX;
}

Assistant:

Result<typename Ctx::FieldIdxT> fieldidx(Ctx& ctx,
                                         typename Ctx::HeapTypeT type) {
  if (auto x = ctx.in.takeU32()) {
    return ctx.getFieldFromIdx(type, *x);
  }
  if (auto id = ctx.in.takeID()) {
    return ctx.getFieldFromName(type, *id);
  }
  return ctx.in.err("expected field index or identifier");
}